

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  ushort **ppuVar5;
  ulong uVar6;
  size_t sVar7;
  proxy_info *ppVar8;
  byte *__s;
  byte *__s_00;
  byte bVar9;
  proxy_info *ppVar10;
  char *proxyuser;
  char *local_50;
  connectdata *local_48;
  proxy_info *local_40;
  char *endp;
  
  proxyuser = (char *)0x0;
  local_50 = (char *)0x0;
  pcVar4 = strstr(proxy,"://");
  __s = (byte *)proxy;
  if (pcVar4 != (char *)0x0) {
    __s = (byte *)(pcVar4 + 3);
    iVar2 = curl_strnequal("https",proxy,5);
    if (iVar2 == 0) {
      iVar2 = curl_strnequal("socks5h",proxy,7);
      if (iVar2 == 0) {
        iVar2 = curl_strnequal("socks5",proxy,6);
        if (iVar2 == 0) {
          iVar2 = curl_strnequal("socks4a",proxy,7);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal("socks4",proxy,6);
            if ((iVar2 == 0) && (iVar2 = curl_strnequal("socks",proxy,5), iVar2 == 0)) {
              iVar2 = curl_strnequal("http:",proxy,5);
              if (iVar2 == 0) {
                Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
                return CURLE_COULDNT_CONNECT;
              }
            }
            else {
              proxytype = CURLPROXY_SOCKS4;
            }
          }
          else {
            proxytype = CURLPROXY_SOCKS4A;
          }
        }
        else {
          proxytype = CURLPROXY_SOCKS5;
        }
      }
      else {
        proxytype = CURLPROXY_SOCKS5_HOSTNAME;
      }
    }
    else {
      proxytype = CURLPROXY_HTTPS;
    }
  }
  pcVar4 = strchr((char *)__s,0x40);
  if (pcVar4 != (char *)0x0) {
    CVar3 = parse_login_details((char *)__s,(long)pcVar4 - (long)__s,&proxyuser,&local_50,
                                (char **)0x0);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    __s = (byte *)(pcVar4 + 1);
  }
  __s_00 = __s;
  if (*__s != 0x5b) goto LAB_00511ca4;
  __s_00 = __s + 1;
  __s = __s_00;
  while( true ) {
    bVar9 = *__s;
    if ((ulong)bVar9 == 0) break;
    ppuVar5 = __ctype_b_loc();
    if (((((*ppuVar5)[bVar9] >> 0xc & 1) == 0) && (bVar9 != 0x2e)) && (bVar9 != 0x3a)) {
      if (bVar9 != 0x25) goto LAB_00511c81;
      if (__s[1] - 0x32 == 0) {
        iVar2 = 0x35 - (uint)__s[2];
      }
      else {
        iVar2 = -(__s[1] - 0x32);
      }
      if (iVar2 != 0) {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
      }
      goto LAB_00511c50;
    }
    __s = __s + 1;
  }
  goto LAB_00511c91;
  while (((((*ppuVar5)[bVar9] & 0x1400) != 0 || (bVar9 - 0x2d < 2)) ||
         ((bVar9 == 0x5f || (bVar9 == 0x7e))))) {
LAB_00511c50:
    __s = __s + 1;
    bVar9 = *__s;
    if ((ulong)bVar9 == 0) goto LAB_00511c91;
  }
LAB_00511c81:
  if (bVar9 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
    goto LAB_00511ca4;
  }
LAB_00511c91:
  Curl_infof(data,"Invalid IPv6 address format\n");
LAB_00511ca4:
  pcVar4 = strchr((char *)__s,0x3a);
  if (pcVar4 == (char *)0x0) {
    if (*__s_00 == 0x2f) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcVar4 = strchr((char *)__s_00,0x2f);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
    }
    uVar6 = (data->set).proxyport;
    if ((uVar6 == 0) && (uVar6 = 0x438, proxytype == CURLPROXY_HTTPS)) {
      uVar6 = 0x1bb;
    }
  }
  else {
    endp = (char *)0x0;
    *pcVar4 = '\0';
    uVar6 = strtol(pcVar4 + 1,&endp,10);
    if (((((endp == (char *)0x0) || (cVar1 = *endp, cVar1 == '\0')) || (cVar1 == '/')) ||
        (cVar1 == ' ')) && (uVar6 < 0x10000)) {
      conn->port = uVar6;
    }
    else {
      Curl_infof(data,"No valid port number in proxy string (%s)\n",pcVar4 + 1);
    }
  }
  if (*__s_00 != 0) {
    ppVar8 = &conn->socks_proxy;
    ppVar10 = &conn->http_proxy;
    if ((proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4) {
      ppVar10 = ppVar8;
    }
    ppVar10->proxytype = proxytype;
    local_48 = conn;
    if (proxyuser != (char *)0x0) {
      local_40 = ppVar8;
      (*Curl_cfree)(ppVar10->user);
      ppVar10->user = (char *)0x0;
      pcVar4 = curl_easy_unescape(data,proxyuser,0,(int *)0x0);
      ppVar10->user = pcVar4;
      (*Curl_cfree)(proxyuser);
      proxyuser = (char *)0x0;
      if (ppVar10->user == (char *)0x0) {
        (*Curl_cfree)(local_50);
        return CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)(ppVar10->passwd);
      pcVar4 = local_50;
      ppVar10->passwd = (char *)0x0;
      if ((local_50 == (char *)0x0) || (sVar7 = strlen(local_50), 0xff < sVar7)) {
        pcVar4 = (*Curl_cstrdup)("");
      }
      else {
        pcVar4 = curl_easy_unescape(data,pcVar4,0,(int *)0x0);
      }
      ppVar10->passwd = pcVar4;
      (*Curl_cfree)(local_50);
      local_50 = (char *)0x0;
      if (ppVar10->passwd == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (local_48->bits).proxy_user_passwd = true;
      ppVar8 = local_40;
    }
    if ((-1 < (long)uVar6) &&
       (((ppVar10->port = uVar6,
         (proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4 ||
         (local_48->port < 0)) || ((ppVar8->host).rawalloc == (char *)0x0)))) {
      local_48->port = uVar6;
    }
    (*Curl_cfree)((ppVar10->host).rawalloc);
    (ppVar10->host).rawalloc = (char *)0x0;
    pcVar4 = (*Curl_cstrdup)((char *)__s_00);
    (ppVar10->host).rawalloc = pcVar4;
    (ppVar10->host).name = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (*Curl_cfree)(proxyuser);
  proxyuser = (char *)0x0;
  (*Curl_cfree)(local_50);
  return CURLE_OK;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  bool sockstype;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("https", proxy))
      proxytype = CURLPROXY_HTTPS;
    else if(checkprefix("socks5h", proxy))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      proxytype = CURLPROXY_SOCKS4;
    else if(checkprefix("http:", proxy))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      return CURLE_COULDNT_CONNECT;
    }
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

#ifndef HTTPS_PROXY_SUPPORT
  if(proxytype == CURLPROXY_HTTPS) {
    failf(data, "Unsupported proxy \'%s\'"
                ", libcurl is built without the HTTPS-proxy support.", proxy);
    return CURLE_NOT_BUILT_IN;
  }
#endif

  sockstype = proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
              proxytype == CURLPROXY_SOCKS5 ||
              proxytype == CURLPROXY_SOCKS4A ||
              proxytype == CURLPROXY_SOCKS4;

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode result =
      parse_login_details(proxyptr, atsign - proxyptr,
                              &proxyuser, &proxypasswd, NULL);
    if(result)
      return result;
    proxyptr = atsign + 1;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unreserved characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    char *endp = NULL;

    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    port = strtol(prox_portno, &endp, 10);
    if((endp && *endp && (*endp != '/') && (*endp != ' ')) ||
       (port < 0) || (port > 65535)) {
      /* meant to detect for example invalid IPv6 numerical addresses without
         brackets: "2a00:fac0:a000::7:13". Accept a trailing slash only
         because we then allow "URL style" with the number followed by a
         slash, used in curl test cases already. Space is also an acceptable
         terminating symbol. */
      infof(data, "No valid port number in proxy string (%s)\n",
            prox_portno);
    }
    else
      conn->port = port;
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = '\0'; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }

  if(*proxyptr) {
    struct proxy_info *proxyinfo =
      sockstype ? &conn->socks_proxy : &conn->http_proxy;
    proxyinfo->proxytype = proxytype;

    if(proxyuser) {
      /* found user and password, rip them out.  note that we are unescaping
         them, as there is otherwise no way to have a username or password
         with reserved characters like ':' in them. */
      Curl_safefree(proxyinfo->user);
      proxyinfo->user = curl_easy_unescape(data, proxyuser, 0, NULL);
      Curl_safefree(proxyuser);

      if(!proxyinfo->user) {
        Curl_safefree(proxypasswd);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(proxyinfo->passwd);
      if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
        proxyinfo->passwd = curl_easy_unescape(data, proxypasswd, 0, NULL);
      else
        proxyinfo->passwd = strdup("");
      Curl_safefree(proxypasswd);

      if(!proxyinfo->passwd)
        return CURLE_OUT_OF_MEMORY;

      conn->bits.proxy_user_passwd = TRUE; /* enable it */
    }

    if(port >= 0) {
      proxyinfo->port = port;
      if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
        conn->port = port;
    }

    /* now, clone the cleaned proxy host name */
    Curl_safefree(proxyinfo->host.rawalloc);
    proxyinfo->host.rawalloc = strdup(proxyptr);
    proxyinfo->host.name = proxyinfo->host.rawalloc;

    if(!proxyinfo->host.rawalloc)
      return CURLE_OUT_OF_MEMORY;
  }

  Curl_safefree(proxyuser);
  Curl_safefree(proxypasswd);

  return CURLE_OK;
}